

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_math.cpp
# Opt level: O2

Mat4x4 * phyr::_Mat4x4::inverse(Mat4x4 *__return_storage_ptr__,Mat4x4 *mat)

{
  int i;
  long lVar1;
  double (*padVar2) [4];
  double *pdVar3;
  int j;
  long lVar4;
  double (*padVar5) [4];
  double *pdVar6;
  int j_1;
  int k;
  long lVar7;
  double dVar8;
  Mat4x4 m;
  
  pdVar3 = (double *)&m;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pdVar3 = *(double *)mat;
    mat = (Mat4x4 *)((long)mat + 8);
    pdVar3 = pdVar3 + 1;
  }
  __return_storage_ptr__->d[3][3] = 1.0;
  __return_storage_ptr__->d[2][2] = 1.0;
  __return_storage_ptr__->d[1][1] = 1.0;
  __return_storage_ptr__->d[0][0] = 1.0;
  __return_storage_ptr__->d[0][1] = 0.0;
  __return_storage_ptr__->d[0][2] = 0.0;
  __return_storage_ptr__->d[0][3] = 0.0;
  __return_storage_ptr__->d[1][0] = 0.0;
  __return_storage_ptr__->d[1][2] = 0.0;
  __return_storage_ptr__->d[1][3] = 0.0;
  __return_storage_ptr__->d[2][0] = 0.0;
  __return_storage_ptr__->d[2][1] = 0.0;
  __return_storage_ptr__->d[2][3] = 0.0;
  __return_storage_ptr__->d[3][0] = 0.0;
  __return_storage_ptr__->d[3][1] = 0.0;
  __return_storage_ptr__->d[3][2] = 0.0;
  padVar2 = (double (*) [4])__return_storage_ptr__;
  pdVar3 = (double *)&m;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    dVar8 = 1.0 / *(double *)((long)m.d + lVar1 * 0x28);
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      pdVar3[lVar4] = pdVar3[lVar4] * dVar8;
      (*(double (*) [4])*padVar2)[lVar4] = (*(double (*) [4])*padVar2)[lVar4] * dVar8;
    }
    padVar5 = (double (*) [4])__return_storage_ptr__;
    pdVar6 = (double *)&m;
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      if (lVar4 != lVar1) {
        dVar8 = -m.d[lVar4][lVar1];
        for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
          pdVar6[lVar7] = pdVar3[lVar7] * dVar8 + pdVar6[lVar7];
          (*padVar5)[lVar7] = (*(double (*) [4])*padVar2)[lVar7] * dVar8 + (*padVar5)[lVar7];
        }
      }
      pdVar6 = pdVar6 + 4;
      padVar5 = padVar5 + 1;
    }
    pdVar3 = pdVar3 + 4;
    padVar2 = padVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Mat4x4 Mat4x4::inverse(const Mat4x4& mat) {
    Mat4x4 m = mat, inv;

    // Reduce m to identity
    for (int i = 0; i < 4; i++) {
        ASSERT(!isZero(m.d[i][i]));
        // Anchor row is i
        Real coeff = 1.0 / m.d[i][i];
        // Normalize anchor row
        for (int j = 0; j < 4; j++) {
            m.d[i][j] *= coeff;
            // Repeat operation on inverse
            inv.d[i][j] *= coeff;
        }

        // Reduce other rows
        for (int j = 0; j < 4; j++) {
            // Skip anchor row
            if (j == i) continue;
            // For every other row,
            // Apply R[j] = R[j] - C[R[j], i] * R[i]
            Real anc = m.d[j][i];
            for (int k = 0; k < 4; k++) {
                m.d[j][k] -= anc * m.d[i][k];
                // Repeat operation on inverse
                inv.d[j][k] -= anc * inv.d[i][k];
            }
        }
    }

    return inv;
}